

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  cpp_dec_float<200U,_int,_void> *in_R8;
  int m;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *lval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int end;
  int k;
  int j;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffac8;
  undefined1 local_510 [128];
  undefined1 local_490 [88];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbc8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbd0;
  undefined1 local_410 [128];
  undefined4 local_390;
  int local_38c;
  undefined1 local_388 [128];
  undefined1 local_308 [128];
  long local_288;
  int *local_280;
  long local_278;
  long local_270;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  uint local_158;
  int local_154;
  int local_150;
  uint local_14c;
  int local_13c;
  long local_138;
  long local_130;
  undefined8 local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  long local_c0;
  undefined1 *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  long local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  long local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_108 = &local_1d8;
  local_13c = in_ECX;
  local_138 = in_RDX;
  local_130 = in_RSI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_R8);
  local_100 = &local_258;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_R8);
  local_260 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x6e3c8f);
  local_278 = *(long *)(in_RDI[5].m_backend.data._M_elems + 0x14);
  local_270._0_4_ = in_RDI[5].m_backend.exp;
  local_270._4_1_ = in_RDI[5].m_backend.neg;
  local_270._5_3_ = *(undefined3 *)&in_RDI[5].m_backend.field_0x75;
  local_288 = *(long *)(in_RDI[5].m_backend.data._M_elems + 0x1a);
  local_158 = in_RDI[5].m_backend.data._M_elems[0x18];
  for (local_14c = in_RDI[5].m_backend.data._M_elems[0x17]; (int)local_14c < (int)local_158;
      local_14c = local_14c + 1) {
    local_98 = local_130 + (long)*(int *)(local_270 + (long)(int)local_14c * 4) * 0x80;
    local_90 = &local_1d8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_R8,in_stack_fffffffffffffac8);
    local_f0 = local_308;
    local_f8 = &local_1d8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_R8,in_stack_fffffffffffffac8);
    local_e0 = local_388;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_R8,in_stack_fffffffffffffac8);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    if (bVar2) {
      local_154 = *(int *)(local_288 + (long)(int)local_14c * 4);
      local_280 = (int *)(local_278 + (long)local_154 * 4);
      local_268 = local_260 + local_154;
      for (local_150 = *(int *)(local_288 + (long)(int)(local_14c + 1) * 4); local_154 < local_150;
          local_150 = local_150 + -1) {
        local_38c = *local_280;
        *(int *)(local_138 + (long)local_13c * 4) = local_38c;
        local_a8 = local_130 + (long)local_38c * 0x80;
        local_a0 = &local_258;
        local_280 = local_280 + 1;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_R8,in_stack_fffffffffffffac8);
        local_390 = 0;
        tVar3 = boost::multiprecision::operator==(in_RDI,(int *)in_R8);
        pnVar1 = local_268;
        local_13c = (uint)tVar3 + local_13c;
        local_68 = local_490;
        local_70 = &local_1d8;
        local_78 = local_268;
        local_268 = local_268 + 1;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_79,local_70,pnVar1);
        local_60 = local_490;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_R8);
        local_48 = local_490;
        local_50 = local_70;
        local_58 = local_78;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_R8,in_stack_fffffffffffffac8,(cpp_dec_float<200U,_int,_void> *)0x6e3fd7);
        local_28 = local_410;
        local_30 = &local_258;
        local_38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_490;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30,local_38);
        local_20 = local_410;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_R8);
        local_8 = local_410;
        local_10 = local_30;
        local_18 = local_38;
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (in_R8,in_stack_fffffffffffffac8,(cpp_dec_float<200U,_int,_void> *)0x6e408e);
        local_b0 = &local_258;
        local_b8 = local_410;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_R8,in_stack_fffffffffffffac8);
        tVar3 = boost::multiprecision::operator!=(in_RDI,(int *)in_R8);
        if (tVar3) {
          local_d0 = local_510;
          local_d8 = &local_258;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (in_R8,in_stack_fffffffffffffac8);
        }
        else {
          local_110 = local_510;
          local_118 = &stack0xfffffffffffffae0;
          local_120 = 0;
          local_88 = local_118;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<200U,_int,_void> *)0x2b2bff2ee48e0530,(double)in_RDI,in_R8);
        }
        local_c0 = local_130 + (long)local_38c * 0x80;
        local_c8 = local_510;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_R8,in_stack_fffffffffffffac8);
      }
    }
  }
  return local_13c;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}